

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

apprun_env_item_t * apprun_env_item_changed_export(apprun_env_item_t *item)

{
  char *pcVar1;
  char *pcVar2;
  apprun_env_item_t *copy_2;
  apprun_env_item_t *copy_1;
  char *new_value;
  char *startup_value_section;
  apprun_env_item_t *copy;
  apprun_env_item_t *item_local;
  
  if ((item->original_value == (char *)0x0) && (item->startup_value == (char *)0x0)) {
    item_local = (apprun_env_item_t *)calloc(1,0x20);
    pcVar1 = strdup(item->name);
    item_local->name = pcVar1;
    pcVar1 = strdup(item->current_value);
    item_local->current_value = pcVar1;
  }
  else if (item->original_value == (char *)0x0) {
    item_local = (apprun_env_item_t *)0x0;
  }
  else {
    new_value = (char *)0x0;
    if ((item->current_value != (char *)0x0) && (item->startup_value != (char *)0x0)) {
      new_value = strstr(item->current_value,item->startup_value);
    }
    if (new_value == (char *)0x0) {
      item_local = (apprun_env_item_t *)calloc(1,0x20);
      pcVar1 = strdup(item->name);
      item_local->name = pcVar1;
      pcVar1 = strdup(item->current_value);
      item_local->current_value = pcVar1;
    }
    else {
      pcVar1 = apprun_env_replace_startup_by_original_section(item,new_value);
      item_local = (apprun_env_item_t *)calloc(1,0x20);
      pcVar2 = strdup(item->name);
      item_local->name = pcVar2;
      item_local->current_value = pcVar1;
    }
  }
  return item_local;
}

Assistant:

apprun_env_item_t *apprun_env_item_changed_export(apprun_env_item_t *item) {
    if (item->original_value == NULL && item->startup_value == NULL) {
        // this is item should not be tracked nor modified

        apprun_env_item_t *copy = calloc(1, sizeof(apprun_env_item_t));
        copy->name = strdup(item->name);
        copy->current_value = strdup(item->current_value);

        return copy;
    }

    if (item->original_value == NULL)
        return NULL;

    // check if the startup_value was extended (pre or post fixed)
    char *startup_value_section = NULL;

    if (item->current_value != NULL && item->startup_value != NULL)
        startup_value_section = strstr(item->current_value, item->startup_value);

    if (startup_value_section != NULL) {
        char *new_value = apprun_env_replace_startup_by_original_section(item, startup_value_section);

        apprun_env_item_t *copy = calloc(1, sizeof(apprun_env_item_t));
        copy->name = strdup(item->name);
        copy->current_value = new_value;

        return copy;
    } else {
        // keep the current value and remove the APPRUN related vars
        apprun_env_item_t *copy = calloc(1, sizeof(apprun_env_item_t));
        copy->name = strdup(item->name);
        copy->current_value = strdup(item->current_value);

        return copy;
    }
}